

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::NewDeferId_abi_cxx11_(string *__return_storage_ptr__,cmGlobalGenerator *this)

{
  unsigned_long __val;
  string sStack_48;
  static_string_view local_28;
  
  local_28.super_string_view._M_len = 2;
  local_28.super_string_view._M_str = "__";
  __val = this->NextDeferId;
  this->NextDeferId = __val + 1;
  std::__cxx11::to_string(&sStack_48,__val);
  cmStrCat<cm::static_string_view,std::__cxx11::string>(__return_storage_ptr__,&local_28,&sStack_48)
  ;
  std::__cxx11::string::~string((string *)&sStack_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::NewDeferId()
{
  return cmStrCat("__"_s, std::to_string(this->NextDeferId++));
}